

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ordering.cpp
# Opt level: O1

char * Kernel::Ordering::resultToString(Result r)

{
  return &DAT_0091bfb0 + *(int *)("N6Kernel8OrderingE" + (long)(int)r * 4 + 0x12);
}

Assistant:

const char* Ordering::resultToString(Result r)
{
  switch(r) {
  case GREATER:
    return "GREATER";
  case LESS:
    return "LESS";
  case EQUAL:
    return "EQUAL";
  case INCOMPARABLE:
    return "INCOMPARABLE";
  default:
    ASSERTION_VIOLATION;
    return 0;
  }
}